

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O3

string * __thiscall
t_dart_generator::function_signature_abi_cxx11_
          (string *__return_storage_ptr__,t_dart_generator *this,t_function *tfunction)

{
  pointer pcVar1;
  long lVar2;
  ulong *puVar3;
  int iVar4;
  undefined8 *puVar5;
  long *plVar6;
  long *plVar7;
  size_type *psVar8;
  ulong uVar9;
  string returntype;
  string arguments;
  string local_130;
  ulong *local_110;
  long local_108;
  undefined1 local_100;
  undefined7 uStack_ff;
  undefined8 uStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80;
  undefined8 uStack_78;
  undefined1 *local_70;
  char *local_68;
  undefined1 local_60 [16];
  string local_50;
  
  argument_list_abi_cxx11_(&local_50,this,tfunction->arglist_);
  local_68 = (char *)0x0;
  local_60[0] = 0;
  local_70 = local_60;
  iVar4 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
  if ((char)iVar4 == '\0') {
    type_name_abi_cxx11_(&local_130,this,tfunction->returntype_);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x386415);
    plVar7 = plVar6 + 2;
    if ((long *)*plVar6 == plVar7) {
      local_e0 = *plVar7;
      lStack_d8 = plVar6[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar7;
      local_f0 = (long *)*plVar6;
    }
    local_e8 = plVar6[1];
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_f0);
    plVar7 = plVar6 + 2;
    if ((long *)*plVar6 == plVar7) {
      local_a0 = *plVar7;
      lStack_98 = plVar6[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar7;
      local_b0 = (long *)*plVar6;
    }
    local_a8 = plVar6[1];
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_b0);
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
  }
  else {
    std::__cxx11::string::_M_replace((ulong)&local_70,0,local_68,0x38512f);
  }
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d0,local_70,local_68 + (long)local_70);
  std::__cxx11::string::append((char *)&local_d0);
  pcVar1 = (tfunction->name_)._M_dataplus._M_p;
  local_110 = (ulong *)&local_100;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar1,pcVar1 + (tfunction->name_)._M_string_length);
  puVar3 = local_110;
  iVar4 = tolower((int)(char)*local_110);
  *(char *)puVar3 = (char)iVar4;
  lVar2 = local_108;
  if (local_110 == (ulong *)&local_100) {
    uStack_78 = uStack_f8;
    local_110 = &local_80;
  }
  local_80 = CONCAT71(uStack_ff,local_100);
  local_88 = local_108;
  local_108 = 0;
  local_100 = 0;
  uVar9 = 0xf;
  if (local_d0 != local_c0) {
    uVar9 = local_c0[0];
  }
  local_90 = local_110;
  if (uVar9 < (ulong)(local_c8 + lVar2)) {
    uVar9 = 0xf;
    if (local_110 != &local_80) {
      uVar9 = local_80;
    }
    if ((ulong)(local_c8 + lVar2) <= uVar9) {
      local_110 = (ulong *)&local_100;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_d0);
      goto LAB_001c0dbf;
    }
  }
  local_110 = (ulong *)&local_100;
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_90);
LAB_001c0dbf:
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  psVar8 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_130.field_2._M_allocated_capacity = *psVar8;
    local_130.field_2._8_8_ = puVar5[3];
  }
  else {
    local_130.field_2._M_allocated_capacity = *psVar8;
    local_130._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_130._M_string_length = puVar5[1];
  *puVar5 = psVar8;
  puVar5[1] = 0;
  *(undefined1 *)psVar8 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_130);
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_e0 = *plVar7;
    lStack_d8 = plVar6[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar7;
    local_f0 = (long *)*plVar6;
  }
  local_e8 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_f0,(ulong)local_50._M_dataplus._M_p);
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_a0 = *plVar7;
    lStack_98 = plVar6[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar7;
    local_b0 = (long *)*plVar6;
  }
  local_a8 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar8) {
    lVar2 = plVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_110 != (ulong *)&local_100) {
    operator_delete(local_110);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_dart_generator::function_signature(t_function* tfunction) {
  std::string arguments = argument_list(tfunction->get_arglist());

  std::string returntype;
  if (tfunction->get_returntype()->is_void()) {
    returntype = "Future";
  } else {
    returntype = "Future<" + type_name(tfunction->get_returntype()) + ">";
  }

  std::string result = returntype + " " + get_member_name(tfunction->get_name()) +
                       "(" + arguments + ")";
  return result;
}